

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexDataMaterials
          (MeshGeometry *this,vector<int,_std::allocator<int>_> *materials_out,Scope *source,
          string *MappingInformationType,string *ReferenceInformationType)

{
  pointer puVar1;
  pointer puVar2;
  pointer piVar3;
  pointer piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  Element *el;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 local_1a8 [376];
  
  puVar1 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != puVar2) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Materials","");
    el = GetRequiredElement(source,(string *)local_1a8,(Element *)0x0);
    ParseVectorDataArray(materials_out,el);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    iVar8 = std::__cxx11::string::compare((char *)MappingInformationType);
    if (iVar8 == 0) {
      piVar3 = (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar3 != piVar4) {
        if (4 < (ulong)((long)piVar4 - (long)piVar3)) {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[73]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [73])
                     "expected only a single material index, ignoring all except the first one");
          LogFunctions<Assimp::FBXImporter>::LogWarn
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          piVar3 = (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish != piVar3) {
            (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = piVar3;
          }
        }
        std::vector<int,_std::allocator<int>_>::resize
                  (materials_out,
                   ((long)(this->m_vertices).
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_vertices).
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
        auVar7 = _DAT_001ed860;
        auVar6 = _DAT_001ec240;
        auVar5 = _DAT_001ec150;
        piVar3 = (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = (long)(materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar3;
        if (lVar10 != 0) {
          iVar8 = *piVar3;
          uVar11 = lVar10 - 4;
          auVar16._8_4_ = (int)uVar11;
          auVar16._0_8_ = uVar11;
          auVar16._12_4_ = (int)(uVar11 >> 0x20);
          auVar13._0_8_ = uVar11 >> 2;
          auVar13._8_8_ = auVar16._8_8_ >> 2;
          uVar12 = 0;
          auVar13 = auVar13 ^ _DAT_001ec150;
          do {
            auVar15._8_4_ = (int)uVar12;
            auVar15._0_8_ = uVar12;
            auVar15._12_4_ = (int)(uVar12 >> 0x20);
            auVar16 = (auVar15 | auVar6) ^ auVar5;
            iVar14 = auVar13._4_4_;
            if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                        iVar14 < auVar16._4_4_) & 1)) {
              piVar3[uVar12] = iVar8;
            }
            if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
                auVar16._12_4_ <= auVar13._12_4_) {
              piVar3[uVar12 + 1] = iVar8;
            }
            auVar16 = (auVar15 | auVar7) ^ auVar5;
            iVar17 = auVar16._4_4_;
            if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar16._0_4_ <= auVar13._0_4_)) {
              piVar3[uVar12 + 2] = iVar8;
              piVar3[uVar12 + 3] = iVar8;
            }
            uVar12 = uVar12 + 4;
          } while (((uVar11 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
          return;
        }
        uVar9 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        _Unwind_Resume(uVar9);
      }
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[34]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [34])"expected material index, ignoring");
      LogFunctions<Assimp::FBXImporter>::LogError
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)MappingInformationType);
      if ((iVar8 == 0) &&
         (iVar8 = std::__cxx11::string::compare((char *)ReferenceInformationType), iVar8 == 0)) {
        std::vector<int,_std::allocator<int>_>::resize
                  (materials_out,(long)puVar1 - (long)puVar2 >> 2);
        if ((long)(materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start == (long)puVar1 - (long)puVar2) {
          return;
        }
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[56]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
      }
      else {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[61]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [61])"ignoring material assignments, access type not implemented: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(MappingInformationType->_M_dataplus)._M_p,
                   MappingInformationType->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(ReferenceInformationType->_M_dataplus)._M_p,
                   ReferenceInformationType->_M_string_length);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void MeshGeometry::ReadVertexDataMaterials(std::vector<int>& materials_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType)
{
    const size_t face_count = m_faces.size();
    if( 0 == face_count )
    {
        return;
    }
    
    // materials are handled separately. First of all, they are assigned per-face
    // and not per polyvert. Secondly, ReferenceInformationType=IndexToDirect
    // has a slightly different meaning for materials.
    ParseVectorDataArray(materials_out,GetRequiredElement(source,"Materials"));

    if (MappingInformationType == "AllSame") {
        // easy - same material for all faces
        if (materials_out.empty()) {
            FBXImporter::LogError(Formatter::format("expected material index, ignoring"));
            return;
        } else if (materials_out.size() > 1) {
            FBXImporter::LogWarn(Formatter::format("expected only a single material index, ignoring all except the first one"));
            materials_out.clear();
        }

        materials_out.resize(m_vertices.size());
        std::fill(materials_out.begin(), materials_out.end(), materials_out.at(0));
    } else if (MappingInformationType == "ByPolygon" && ReferenceInformationType == "IndexToDirect") {
        materials_out.resize(face_count);

        if(materials_out.size() != face_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
                << materials_out.size() << ", expected " << face_count
            );
            return;
        }
    } else {
        FBXImporter::LogError(Formatter::format("ignoring material assignments, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}